

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_QuakeEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  VMValue *pVVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  AActor *activator;
  PClass *pPVar7;
  int iVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  char *pcVar10;
  VMValue *pVVar11;
  VMValue *pVVar12;
  VMValue *pVVar13;
  VMValue *pVVar14;
  VMValue *pVVar15;
  VMValue *pVVar16;
  VMValue *pVVar17;
  bool bVar18;
  FSoundID local_34;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      activator = (AActor *)(param->field_0).field_1.a;
      if (activator != (AActor *)0x0) {
        if ((activator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar8 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
          (activator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar8);
        }
        pPVar9 = (activator->super_DThinker).super_DObject.Class;
        bVar18 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar7 && bVar18) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar18 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar7) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar18) {
          pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dabd5;
        }
      }
      if (numparam == 1) {
        pcVar10 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar10 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
              if (numparam == 3) {
                pcVar10 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  if (numparam < 5) {
                    pcVar10 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      if (numparam == 5) {
                        pcVar10 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          if (numparam < 7) {
                            pcVar10 = "(paramnum) < numparam";
                          }
                          else {
                            if (param[6].field_0.field_3.Type == '\0') {
                              pVVar1 = param + 1;
                              pVVar2 = param + 2;
                              pVVar3 = param + 3;
                              pVVar4 = param + 4;
                              pVVar5 = param + 5;
                              pVVar6 = param + 6;
                              if (numparam == 7) {
                                if (defaultparam->Array[7].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dabf4:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x1444,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              else if (param[7].field_0.field_3.Type != '\0') {
                                pcVar10 = "(param[paramnum]).Type == REGT_INT";
                                goto LAB_003dabf4;
                              }
                              if (numparam < 9) {
                                pVVar11 = defaultparam->Array;
                                if (pVVar11[8].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                                  goto LAB_003dac13;
                                }
                              }
                              else {
                                pVVar11 = param;
                                if (param[8].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003dac13:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x1445,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 10) {
                                pVVar12 = defaultparam->Array;
                                if (pVVar12[9].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                                  goto LAB_003dac32;
                                }
                              }
                              else {
                                pVVar12 = param;
                                if (param[9].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dac32:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x1446,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 0xb) {
                                pVVar13 = defaultparam->Array;
                                if (pVVar13[10].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                                  goto LAB_003dac51;
                                }
                              }
                              else {
                                pVVar13 = param;
                                if (param[10].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dac51:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x1447,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 0xc) {
                                pVVar14 = defaultparam->Array;
                                if (pVVar14[0xb].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                                  goto LAB_003dac70;
                                }
                              }
                              else {
                                pVVar14 = param;
                                if (param[0xb].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dac70:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x1448,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 0xd) {
                                pVVar15 = defaultparam->Array;
                                if (pVVar15[0xc].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                                  goto LAB_003dac8f;
                                }
                              }
                              else {
                                pVVar15 = param;
                                if (param[0xc].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003dac8f:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x1449,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 0xe) {
                                pVVar16 = defaultparam->Array;
                                if (pVVar16[0xd].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                                  goto LAB_003dacae;
                                }
                              }
                              else {
                                pVVar16 = param;
                                if (param[0xd].field_0.field_3.Type != '\0') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003dacae:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x144a,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 0xf) {
                                pVVar17 = defaultparam->Array;
                                if (pVVar17[0xe].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                                  goto LAB_003daccd;
                                }
                              }
                              else {
                                pVVar17 = param;
                                if (param[0xe].field_0.field_3.Type != '\x01') {
                                  pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003daccd:
                                  __assert_fail(pcVar10,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                                ,0x144b,
                                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                               );
                                }
                              }
                              if (numparam < 0x10) {
                                param = defaultparam->Array;
                                if (param[0xf].field_0.field_3.Type == '\x01') goto LAB_003daa8e;
                                pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                              }
                              else {
                                if (param[0xf].field_0.field_3.Type == '\x01') {
LAB_003daa8e:
                                  P_StartQuakeXYZ(activator,0,(pVVar1->field_0).i,
                                                  (pVVar2->field_0).i,(pVVar3->field_0).i,
                                                  (pVVar4->field_0).i,(pVVar5->field_0).i,
                                                  (pVVar6->field_0).i,&local_34,pVVar11[8].field_0.i
                                                  ,pVVar12[9].field_0.f,pVVar13[10].field_0.f,
                                                  pVVar14[0xb].field_0.f,pVVar15[0xc].field_0.i,
                                                  pVVar16[0xd].field_0.i,pVVar17[0xe].field_0.f,
                                                  param[0xf].field_0.f);
                                  return 0;
                                }
                                pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
                              }
                              __assert_fail(pcVar10,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                            ,0x144c,
                                            "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                            pcVar10 = "param[paramnum].Type == REGT_INT";
                          }
                          __assert_fail(pcVar10,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x1443,
                                        "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                        pcVar10 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x1442,
                                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar10 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x1441,
                                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar10 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1440,
                            "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar10 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x143f,
                        "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar10 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x143e,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003dabd5:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x143d,
                "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_QuakeEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(intensityX);
	PARAM_INT(intensityY);
	PARAM_INT(intensityZ);
	PARAM_INT(duration);
	PARAM_INT(damrad);
	PARAM_INT(tremrad);
	PARAM_SOUND_DEF(sound);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(mulWaveX);
	PARAM_FLOAT_DEF(mulWaveY);
	PARAM_FLOAT_DEF(mulWaveZ);
	PARAM_INT_DEF(falloff);
	PARAM_INT_DEF(highpoint);
	PARAM_FLOAT_DEF(rollIntensity);
	PARAM_FLOAT_DEF(rollWave);
	P_StartQuakeXYZ(self, 0, intensityX, intensityY, intensityZ, duration, damrad, tremrad, sound, flags, mulWaveX, mulWaveY, mulWaveZ, falloff, highpoint, 
		rollIntensity, rollWave);
	return 0;
}